

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

bool __thiscall QLocale::equals(QLocale *this,QLocale *other)

{
  QLocalePrivate *pQVar1;
  QLocalePrivate *pQVar2;
  
  pQVar1 = (this->d).d.ptr;
  pQVar2 = (other->d).d.ptr;
  if (pQVar1->m_data != pQVar2->m_data) {
    return false;
  }
  return (pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
         super_QFlagsStorage<QLocale::NumberOption>.i ==
         (pQVar2->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
         super_QFlagsStorage<QLocale::NumberOption>.i;
}

Assistant:

constexpr P get() const noexcept { return ptr; }